

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

size_t __thiscall
flexbuffers::Builder::CreateBlob(Builder *this,void *data,size_t len,size_t trailing,Type type)

{
  pointer *ppVVar1;
  iterator __position;
  pointer puVar2;
  iterator __position_00;
  difference_type __offset;
  ulong byte_width;
  anon_union_8_3_83789bcb_for_Value_0 aVar3;
  int iVar4;
  anon_union_8_3_83789bcb_for_Value_0 local_40;
  Type TStack_38;
  int iStack_34;
  
  iVar4 = 0;
  if ((0xff < len) && (iVar4 = 1, 0xffff < len)) {
    iVar4 = 3 - (uint)(len >> 0x20 == 0);
  }
  byte_width = (ulong)(uint)(1 << ((byte)iVar4 & 0x1f));
  __position._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_40.u_ = local_40.u_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&this->buf_,__position,
             byte_width - 1 &
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)__position._M_current,
             (value_type_conflict1 *)&local_40.u_);
  Write<unsigned_long>(this,len,byte_width);
  puVar2 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  aVar3.i_ = (long)puVar2 -
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,puVar2,data,
             (long)data + trailing + len);
  __position_00._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40.i_ = aVar3.i_;
    TStack_38 = type;
    iStack_34 = iVar4;
    std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
    _M_realloc_insert<flexbuffers::Builder::Value>(&this->stack_,__position_00,(Value *)&local_40);
  }
  else {
    ((__position_00._M_current)->field_0).i_ = (int64_t)aVar3;
    (__position_00._M_current)->type_ = type;
    (__position_00._M_current)->min_bit_width_ = iVar4;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return aVar3.i_;
}

Assistant:

size_t CreateBlob(const void *data, size_t len, size_t trailing, Type type) {
    auto bit_width = WidthU(len);
    auto byte_width = Align(bit_width);
    Write<uint64_t>(len, byte_width);
    auto sloc = buf_.size();
    WriteBytes(data, len + trailing);
    stack_.push_back(Value(static_cast<uint64_t>(sloc), type, bit_width));
    return sloc;
  }